

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O2

void __thiscall embree::OBJLoader::loadMTL(OBJLoader *this,FileName *fileName)

{
  char *pcVar1;
  byte bVar2;
  undefined4 uVar3;
  _Alloc_hider _Var4;
  char cVar5;
  bool bVar6;
  int iVar7;
  size_t sVar8;
  mapped_type *pmVar9;
  ostream *poVar10;
  runtime_error *this_00;
  _Alloc_hider in_RCX;
  fd_set *__readfds;
  fd_set *__readfds_00;
  long lVar11;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *p_Var12;
  string *this_01;
  fd_set *in_R8;
  timeval *in_R9;
  float fVar13;
  char *token;
  undefined1 local_4f0 [40];
  string name;
  string line;
  string next_line;
  undefined1 local_438 [152];
  element_type *local_3a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_398;
  float local_390;
  undefined8 local_38c;
  undefined8 uStack_384;
  undefined8 local_37c;
  undefined1 local_374 [28];
  undefined1 local_358 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_338;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_328;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_318;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_308;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_2f8;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_2e8;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_2d8;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_2b8;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_2a8;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_298;
  float local_288;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_280;
  float local_270;
  undefined1 local_26c [8];
  undefined8 uStack_264;
  undefined8 local_25c;
  anon_union_12_2_4062524c_for_Vec3<float>_1 local_254;
  anon_union_12_2_4062524c_for_Vec3<float>_1 aStack_248;
  ifstream cin;
  
  std::ifstream::ifstream(&cin);
  std::ifstream::open((char *)&cin,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 == '\0') {
    poVar10 = std::operator<<((ostream *)&std::cerr,"cannot open ");
    std::__cxx11::string::string((string *)local_358,(string *)fileName);
    poVar10 = std::operator<<(poVar10,(string *)local_358);
    std::endl<char,std::char_traits<char>>(poVar10);
    this_01 = (string *)local_358;
  }
  else {
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    local_358._0_8_ = (pointer)0x0;
    local_358._8_8_ = 0x3f8000003f800000;
    local_358._16_4_ = 1.0;
    local_338 = (anon_union_16_2_47237d3f_for_Vec3fa_0)ZEXT816(0);
    local_328._8_8_ = 0x3f8000003f800000;
    local_328._0_8_ = 0x3f8000003f800000;
    local_280._M_ptr = (element_type *)0x0;
    local_280._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    memset(&local_318,0,0x94);
    local_270 = 1.0;
    local_25c = 0;
    local_26c = (undefined1  [8])0x0;
    uStack_264 = 0;
    local_254._0_8_ = (pointer)0x3fb333333fb33333;
    local_254.field_0.z = 1.4;
    aStack_248._0_8_ = (pointer)0x4040000040400000;
    aStack_248.field_0.z = 3.0;
    local_4f0._32_8_ = &this->material;
    local_4f0._16_8_ = this;
    while( true ) {
      iVar7 = std::istream::peek();
      if (iVar7 == -1) break;
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&cin,(string *)&line);
      while( true ) {
        if ((line._M_string_length == 0) ||
           (in_RCX._M_p = line._M_dataplus._M_p,
           line._M_dataplus._M_p[line._M_string_length - 1] != '\\')) goto LAB_0013ecb2;
        line._M_dataplus._M_p[line._M_string_length - 1] = ' ';
        next_line._M_string_length._0_4_ = 0.0;
        next_line._M_string_length._4_4_ = 0;
        next_line.field_2._M_allocated_capacity._0_4_ =
             next_line.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        next_line._M_dataplus._M_p = (pointer)&next_line.field_2;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&cin,(string *)&next_line);
        if (CONCAT44(next_line._M_string_length._4_4_,(float)next_line._M_string_length) == 0)
        break;
        std::__cxx11::string::append((string *)&line);
        std::__cxx11::string::~string((string *)&next_line);
      }
      std::__cxx11::string::~string((string *)&next_line);
LAB_0013ecb2:
      _Var4._M_p = line._M_dataplus._M_p;
      sVar8 = strspn(line._M_dataplus._M_p," \t");
      pcVar1 = _Var4._M_p + sVar8;
      trimEnd(pcVar1);
      cVar5 = _Var4._M_p[sVar8];
      lVar11 = 5;
      token = pcVar1;
      if ((cVar5 != '\0') && (cVar5 != '#')) {
        iVar7 = strncmp(pcVar1,"newmtl",6);
        if (iVar7 == 0) {
          bVar6 = std::operator!=(&name,"");
          if (bVar6) {
            ExtObjMaterial::select
                      ((ExtObjMaterial *)&next_line,(int)local_358,__readfds,(fd_set *)in_RCX._M_p,
                       in_R8,in_R9);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                                   *)local_4f0._32_8_,&name);
            if (pmVar9->ptr != (MaterialNode *)0x0) {
              (*(pmVar9->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
            }
            pmVar9->ptr = (MaterialNode *)next_line._M_dataplus._M_p;
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                                   *)local_4f0._32_8_,&name);
            std::__cxx11::string::_M_assign((string *)&(pmVar9->ptr->super_Node).name);
          }
          token = token + 6;
          parseSep(&token);
          std::__cxx11::string::assign((char *)&name);
          memset((ExtObjMaterial *)&next_line,0,0x120);
          next_line._M_string_length._0_4_ = 1.0;
          next_line._M_string_length._4_4_ = 0x3f800000;
          next_line.field_2._M_allocated_capacity._0_4_ = 0x3f800000;
          local_3a0 = (element_type *)0x0;
          _Stack_398._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          memset(local_438,0,0x94);
          local_390 = 1.0;
          local_37c = 0;
          local_38c = 0;
          uStack_384 = 0;
          local_374._0_8_ = 0x3fb333333fb33333;
          local_374._8_8_ = 0x404000003fb33333;
          local_374._16_8_ = 0x4040000040400000;
          ExtObjMaterial::operator=((ExtObjMaterial *)local_358,(ExtObjMaterial *)&next_line);
          ExtObjMaterial::~ExtObjMaterial((ExtObjMaterial *)&next_line);
        }
        else {
          bVar6 = std::operator==(&name,"");
          pcVar1 = token;
          if (bVar6) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this_00,"invalid material file: newmtl expected first");
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar7 = strncmp(token,"illum",5);
          if (iVar7 == 0) {
LAB_0013f6c9:
            token = pcVar1 + lVar11;
            parseSep(&token);
          }
          else {
            bVar2 = *pcVar1;
            if (bVar2 == 0x4e) {
              if (pcVar1[1] == 's') {
                token = pcVar1 + 2;
                parseSep(&token);
                fVar13 = getFloat(&token);
                local_358._12_4_ = fVar13;
              }
              else {
                if (pcVar1[1] != 'i') goto LAB_0013ef1a;
                token = pcVar1 + 2;
                parseSep(&token);
LAB_0013ef04:
                local_358._16_4_ = getFloat(&token);
              }
            }
            else if (bVar2 == 100) {
              token = pcVar1 + 1;
              parseSep(&token);
              fVar13 = getFloat(&token);
              local_358._8_4_ = fVar13;
            }
            else {
LAB_0013ef1a:
              local_4f0._28_4_ = ZEXT14(bVar2);
              iVar7 = strncmp(pcVar1,"map_d",5);
              if (iVar7 == 0) {
LAB_0013f12a:
                token = pcVar1 + 5;
                parseSep(&token);
                FileName::FileName((FileName *)&next_line,token);
                loadTexture((OBJLoader *)local_4f0,(FileName *)local_4f0._16_8_);
                p_Var12 = &local_2f8;
              }
              else {
                iVar7 = strncmp(pcVar1,"d_map",5);
                if (iVar7 == 0) goto LAB_0013f12a;
                iVar7 = strncmp(pcVar1,"map_Ka",6);
                if (iVar7 == 0) {
LAB_0013f168:
                  token = pcVar1 + 6;
                  parseSep(&token);
                  FileName::FileName((FileName *)&next_line,token);
                  loadTexture((OBJLoader *)local_4f0,(FileName *)local_4f0._16_8_);
                  p_Var12 = &local_2e8;
                }
                else {
                  iVar7 = strncmp(pcVar1,"Ka_map",6);
                  if (iVar7 == 0) goto LAB_0013f168;
                  iVar7 = strncmp(pcVar1,"map_Kd",6);
                  if (iVar7 == 0) {
LAB_0013f1a6:
                    token = pcVar1 + 6;
                    parseSep(&token);
                    FileName::FileName((FileName *)&next_line,token);
                    loadTexture((OBJLoader *)local_4f0,(FileName *)local_4f0._16_8_);
                    p_Var12 = &local_2d8;
                  }
                  else {
                    iVar7 = strncmp(pcVar1,"Kd_map",6);
                    if (iVar7 == 0) goto LAB_0013f1a6;
                    iVar7 = strncmp(pcVar1,"map_Ks",6);
                    if (iVar7 == 0) {
LAB_0013f1e4:
                      token = pcVar1 + 6;
                      parseSep(&token);
                      FileName::FileName((FileName *)&next_line,token);
                      loadTexture((OBJLoader *)local_4f0,(FileName *)local_4f0._16_8_);
                      p_Var12 = &local_2c8;
                    }
                    else {
                      iVar7 = strncmp(pcVar1,"Ks_map",6);
                      if (iVar7 == 0) goto LAB_0013f1e4;
                      iVar7 = strncmp(pcVar1,"map_Kt",6);
                      if (iVar7 == 0) {
LAB_0013f21f:
                        token = pcVar1 + 6;
                        parseSep(&token);
                        FileName::FileName((FileName *)&next_line,token);
                        loadTexture((OBJLoader *)local_4f0,(FileName *)local_4f0._16_8_);
LAB_0013f283:
                        p_Var12 = &local_2b8;
                      }
                      else {
                        iVar7 = strncmp(pcVar1,"Kt_map",6);
                        if (iVar7 == 0) goto LAB_0013f21f;
                        iVar7 = strncmp(pcVar1,"map_Tf",6);
                        if (iVar7 == 0) {
LAB_0013f252:
                          token = pcVar1 + 6;
                          parseSep(&token);
                          FileName::FileName((FileName *)&next_line,token);
                          loadTexture((OBJLoader *)local_4f0,(FileName *)local_4f0._16_8_);
                          goto LAB_0013f283;
                        }
                        iVar7 = strncmp(pcVar1,"Tf_map",6);
                        if (iVar7 == 0) goto LAB_0013f252;
                        iVar7 = strncmp(pcVar1,"map_Ns",6);
                        if (iVar7 == 0) {
LAB_0013f2aa:
                          token = pcVar1 + 6;
                          parseSep(&token);
                          FileName::FileName((FileName *)&next_line,token);
                          loadTexture((OBJLoader *)local_4f0,(FileName *)local_4f0._16_8_);
                          p_Var12 = &local_2a8;
                        }
                        else {
                          iVar7 = strncmp(pcVar1,"Ns_map",6);
                          if (iVar7 == 0) goto LAB_0013f2aa;
                          iVar7 = strncmp(pcVar1,"map_Displ",9);
                          if (iVar7 != 0) {
                            iVar7 = strncmp(pcVar1,"Displ_map",9);
                            uVar3 = local_4f0._28_4_;
                            if (iVar7 != 0) {
                              if (local_4f0._28_4_ == 0x54) {
                                if (pcVar1[1] != 'f') goto LAB_0013f40d;
                                token = pcVar1 + 2;
                                parseSep(&token);
LAB_0013f33e:
                                getVec3f((embree *)&next_line,&token);
                                local_308.m128[2] = (float)next_line._M_string_length;
                                local_308._0_8_ = next_line._M_dataplus._M_p;
                                local_308.m128[3] = 0.0;
                              }
                              else if (local_4f0._28_4_ == 0x4b) {
                                if (pcVar1[1] == 'a') {
                                  token = pcVar1 + 2;
                                  parseSep(&token);
                                  getVec3f((embree *)&next_line,&token);
                                  local_338.m128[2] = (float)next_line._M_string_length;
                                  local_338._0_8_ = next_line._M_dataplus._M_p;
                                  local_338.m128[3] = 0.0;
                                }
                                else {
                                  if (pcVar1[1] == 'd') {
                                    token = pcVar1 + 2;
                                    parseSep(&token);
                                    goto LAB_0013f6f5;
                                  }
                                  if (pcVar1[1] != 's') {
                                    if (pcVar1[1] == 't') {
                                      token = pcVar1 + 2;
                                      parseSep(&token);
                                      goto LAB_0013f33e;
                                    }
                                    goto LAB_0013f40d;
                                  }
                                  token = pcVar1 + 2;
                                  parseSep(&token);
                                  getVec3f((embree *)&next_line,&token);
                                  local_318.m128[2] = (float)next_line._M_string_length;
                                  local_318._0_8_ = next_line._M_dataplus._M_p;
                                  local_318.m128[3] = 0.0;
                                }
                              }
                              else {
LAB_0013f40d:
                                iVar7 = strncmp(pcVar1,"type",4);
                                if (iVar7 == 0) {
                                  token = pcVar1 + 4;
                                  parseSep(&token);
                                  std::__cxx11::string::string
                                            ((string *)&next_line,token,(allocator *)local_4f0);
                                  bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&next_line,"matte");
                                  if (bVar6) {
                                    local_358._0_4_ = 1;
                                  }
                                  else {
                                    bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&next_line,"glass");
                                    if (bVar6) {
                                      local_358._0_4_ = 2;
                                    }
                                    else {
                                      bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&next_line,"metal");
                                      if (bVar6) {
                                        local_358._0_4_ = 3;
                                      }
                                      else {
                                        bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&next_line,"metallicPaint");
                                        if (bVar6) {
                                          local_358._0_4_ = 4;
                                        }
                                        else {
                                          bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&next_line,"principled");
                                          if (!bVar6) {
                                            bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&next_line,"luminous");
                                            if (!bVar6) goto LAB_0013f847;
                                          }
                                          local_358._0_8_ = local_358._0_8_ & 0xffffffff00000000;
                                        }
                                      }
                                    }
                                  }
                                }
                                else {
                                  iVar7 = strncmp(pcVar1,"baseColor",9);
                                  if (iVar7 == 0) {
                                    token = pcVar1 + 9;
                                    parseSep(&token);
                                    goto LAB_0013f6f5;
                                  }
                                  if (((uVar3 == 0x69) && (pcVar1[1] == 'o')) && (pcVar1[2] == 'r'))
                                  {
                                    token = pcVar1 + 3;
                                    parseSep(&token);
                                    goto LAB_0013ef04;
                                  }
                                  iVar7 = strncmp(pcVar1,"map_baseColor",0xd);
                                  if (iVar7 == 0) {
                                    token = pcVar1 + 0xd;
                                    parseSep(&token);
                                    FileName::FileName((FileName *)&next_line,token);
                                    loadTexture((OBJLoader *)local_4f0,(FileName *)local_4f0._16_8_)
                                    ;
LAB_0013f775:
                                    p_Var12 = &local_2d8;
                                  }
                                  else {
                                    iVar7 = strncmp(pcVar1,"map_specular",0xc);
                                    if (iVar7 == 0) {
                                      token = pcVar1 + 0xc;
                                      parseSep(&token);
                                      FileName::FileName((FileName *)&next_line,token);
                                      loadTexture((OBJLoader *)local_4f0,
                                                  (FileName *)local_4f0._16_8_);
                                      p_Var12 = &local_2c8;
                                    }
                                    else {
                                      lVar11 = 0x10;
                                      iVar7 = strncmp(pcVar1,"map_normal.scale",0x10);
                                      if (iVar7 == 0) goto LAB_0013f6c9;
                                      iVar7 = strncmp(pcVar1,"map_normal",10);
                                      if (iVar7 != 0) {
                                        iVar7 = strncmp(pcVar1,"transmissionColor",0x11);
                                        if (iVar7 == 0) {
                                          token = pcVar1 + 0x11;
                                          parseSep(&token);
                                          goto LAB_0013f33e;
                                        }
                                        iVar7 = strncmp(pcVar1,"transmission",0xc);
                                        if (iVar7 == 0) {
                                          token = pcVar1 + 0xc;
                                          parseSep(&token);
                                          fVar13 = getFloat(&token);
                                          local_308.m128[1] = fVar13;
                                          local_308.m128[0] = fVar13;
                                          local_308.m128[2] = fVar13;
                                          local_308.m128[3] = 0.0;
                                        }
                                        else {
                                          iVar7 = strncmp(pcVar1,"roughnessMap",0xc);
                                          if (iVar7 == 0) {
                                            token = pcVar1 + 0xc;
                                            parseSep(&token);
                                            FileName::FileName((FileName *)&next_line,token);
                                            loadTexture((OBJLoader *)local_4f0,
                                                        (FileName *)local_4f0._16_8_);
                                            p_Var12 = &local_280;
                                            goto LAB_0013f833;
                                          }
                                          iVar7 = strncmp(pcVar1,"roughness",9);
                                          if (iVar7 == 0) {
                                            token = pcVar1 + 9;
                                            parseSep(&token);
                                            local_288 = getFloat(&token);
                                            local_358._12_4_ = 1.0 / (local_288 + 1e-06);
                                          }
                                          else {
                                            iVar7 = strncmp(pcVar1,"colorMap",8);
                                            if (iVar7 == 0) {
                                              token = pcVar1 + 8;
                                              parseSep(&token);
                                              FileName::FileName((FileName *)&next_line,token);
                                              loadTexture((OBJLoader *)local_4f0,
                                                          (FileName *)local_4f0._16_8_);
                                              goto LAB_0013f775;
                                            }
                                            iVar7 = strncmp(pcVar1,"color",5);
                                            if (iVar7 == 0) {
                                              token = pcVar1 + 5;
                                              parseSep(&token);
                                            }
                                            else {
                                              iVar7 = strncmp(pcVar1,"coat.color",10);
                                              if (iVar7 != 0) {
                                                iVar7 = strncmp(pcVar1,"coat.eta",8);
                                                if (iVar7 == 0) {
                                                  token = pcVar1 + 8;
                                                  parseSep(&token);
                                                  local_270 = getFloat(&token);
                                                }
                                                else {
                                                  iVar7 = strncmp(pcVar1,"coat.roughnessMap",0x11);
                                                  if (iVar7 == 0) {
                                                    token = pcVar1 + 0x11;
                                                    parseSep(&token);
                                                    FileName::FileName((FileName *)&next_line,token)
                                                    ;
                                                    loadTexture((OBJLoader *)local_4f0,
                                                                (FileName *)local_4f0._16_8_);
                                                    p_Var12 = (
                                                  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                                  *)(local_26c + 4);
                                                  goto LAB_0013f833;
                                                  }
                                                  iVar7 = strncmp(pcVar1,"coat.roughness",0xe);
                                                  if (iVar7 == 0) {
                                                    token = pcVar1 + 0xe;
                                                    parseSep(&token);
                                                    fVar13 = getFloat(&token);
                                                    local_26c._0_4_ = fVar13;
                                                  }
                                                  else {
                                                    iVar7 = strncmp(pcVar1,"bumpMap",7);
                                                    if (iVar7 == 0) {
                                                      token = pcVar1 + 7;
                                                      parseSep(&token);
                                                      FileName::FileName((FileName *)&next_line,
                                                                         token);
                                                      loadTexture((OBJLoader *)local_4f0,
                                                                  (FileName *)local_4f0._16_8_);
                                                      goto LAB_0013f82b;
                                                    }
                                                    iVar7 = strncmp(pcVar1,"bump",4);
                                                    if (iVar7 == 0) {
                                                      token = pcVar1 + 4;
                                                      parseSep(&token);
                                                      fVar13 = getFloat(&token);
                                                      local_25c._4_4_ = fVar13;
                                                    }
                                                    else if (local_4f0._28_4_ == 0x6b) {
                                                      token = pcVar1 + 1;
                                                      parseSep(&token);
                                                      getVec3f((embree *)&next_line,&token);
                                                      aStack_248.field_0.z =
                                                           (float)next_line._M_string_length;
                                                      aStack_248._0_8_ = next_line._M_dataplus;
                                                    }
                                                    else if (((local_4f0._28_4_ == 0x65) &&
                                                             (pcVar1[1] == 't')) &&
                                                            (pcVar1[2] == 'a')) {
                                                      token = pcVar1 + 3;
                                                      parseSep(&token);
                                                      getVec3f((embree *)&next_line,&token);
                                                      local_254._0_8_ = next_line._M_dataplus._M_p;
                                                      local_254.field_0.z =
                                                           (float)next_line._M_string_length;
                                                    }
                                                  }
                                                }
                                                goto LAB_0013f6d8;
                                              }
                                              token = pcVar1 + 10;
                                              parseSep(&token);
                                            }
LAB_0013f6f5:
                                            getVec3f((embree *)&next_line,&token);
                                            local_328.m128[2] = (float)next_line._M_string_length;
                                            local_328._0_8_ = next_line._M_dataplus._M_p;
                                            local_328.m128[3] = 0.0;
                                          }
                                        }
                                        goto LAB_0013f6d8;
                                      }
                                      token = pcVar1 + 10;
                                      parseSep(&token);
                                      FileName::FileName((FileName *)&next_line,token);
                                      loadTexture((OBJLoader *)local_4f0,
                                                  (FileName *)local_4f0._16_8_);
LAB_0013f82b:
                                      p_Var12 = &local_298;
                                    }
                                  }
LAB_0013f833:
                                  std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::
                                  operator=(p_Var12,(
                                                  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                                                  *)local_4f0);
                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                             (local_4f0 + 8));
                                }
LAB_0013f847:
                                std::__cxx11::string::~string((string *)&next_line);
                              }
                              goto LAB_0013f6d8;
                            }
                          }
                          token = pcVar1 + 9;
                          parseSep(&token);
                          FileName::FileName((FileName *)&next_line,token);
                          loadTexture((OBJLoader *)local_4f0,(FileName *)local_4f0._16_8_);
                          p_Var12 = &local_298;
                        }
                      }
                    }
                  }
                }
              }
              std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                        (p_Var12,(__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)
                                 local_4f0);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4f0 + 8));
              std::__cxx11::string::~string((string *)&next_line);
            }
          }
        }
      }
LAB_0013f6d8:
      std::__cxx11::string::~string((string *)&line);
    }
    bVar6 = std::operator!=(&name,"");
    if (bVar6) {
      ExtObjMaterial::select
                ((ExtObjMaterial *)&next_line,(int)local_358,__readfds_00,(fd_set *)in_RCX._M_p,
                 in_R8,in_R9);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                             *)local_4f0._32_8_,&name);
      if (pmVar9->ptr != (MaterialNode *)0x0) {
        (*(pmVar9->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      pmVar9->ptr = (MaterialNode *)next_line._M_dataplus._M_p;
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                             *)local_4f0._32_8_,&name);
      std::__cxx11::string::_M_assign((string *)&(pmVar9->ptr->super_Node).name);
    }
    std::ifstream::close();
    ExtObjMaterial::~ExtObjMaterial((ExtObjMaterial *)local_358);
    this_01 = &name;
  }
  std::__cxx11::string::~string((string *)this_01);
  std::ifstream::~ifstream(&cin);
  return;
}

Assistant:

void OBJLoader::loadMTL(const FileName &fileName)
  {
    std::ifstream cin;
    cin.open(fileName.c_str());
    if (!cin.is_open()) {
      std::cerr << "cannot open " << fileName.str() << std::endl;
      return;
    }

    std::string name;
    ExtObjMaterial cur;

    while (cin.peek() != -1)
    {
      /* load next multiline */
      std::string line; std::getline(cin,line);
      while (!line.empty() && line[line.size()-1] == '\\') {
	line[line.size()-1] = ' ';
	std::string next_line; std::getline(cin,next_line);
	if (next_line.empty()) break;
	line += next_line;
      }
      const char* token = trimEnd(line.c_str() + strspn(line.c_str(), " \t"));

      if (token[0] == 0  ) continue; // ignore empty lines
      if (token[0] == '#') continue; // ignore comments

      if (!strncmp(token, "newmtl", 6)) 
      {
        if (name != "") {
          material[name] = cur.select();
          material[name]->name = name;
        }
        
        parseSep(token+=6);
        name = token;
        cur = ExtObjMaterial();
        continue;
      }
      if (name == "") THROW_RUNTIME_ERROR("invalid material file: newmtl expected first");
      
      try 
      {
        if (!strncmp(token, "illum", 5)) { parseSep(token += 5);  continue; }
        
        if (!strncmp(token, "d",  1)) { parseSep(token += 1);  cur.d  = getFloat(token); continue; }
        if (!strncmp(token, "Ns", 2)) { parseSep(token += 2);  cur.Ns = getFloat(token); continue; }
        if (!strncmp(token, "Ni", 2)) { parseSep(token += 2);  cur.Ni = getFloat(token); continue; }
        
        if (!strncmp(token, "map_d", 5) || !strncmp(token, "d_map", 5)) {
          parseSep(token += 5);
          cur.map_d = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Ka", 6) || !strncmp(token, "Ka_map", 6)) {
          parseSep(token += 6);
          cur.map_Ka = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Kd", 6) || !strncmp(token, "Kd_map", 6)) {
          parseSep(token += 6);
          cur.map_Kd = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Ks", 6) || !strncmp(token, "Ks_map", 6)) {
          parseSep(token += 6);
          cur.map_Ks = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Kt", 6) || !strncmp(token, "Kt_map", 6)) {
          parseSep(token += 6);
          cur.map_Kt = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Tf", 6) || !strncmp(token, "Tf_map", 6)) {
          parseSep(token += 6);
          cur.map_Kt = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Ns", 6) || !strncmp(token, "Ns_map", 6)) {
          parseSep(token += 6);
          cur.map_Ns = loadTexture(FileName(token));
          continue;
        }
        if (!strncmp(token, "map_Displ", 9) || !strncmp(token, "Displ_map", 9)) {
          parseSep(token += 9);
          cur.map_Displ = loadTexture(FileName(token));
          continue;
        }
        
        if (!strncmp(token, "Ka", 2)) { parseSep(token += 2);  cur.Ka = getVec3f(token); continue; }
        if (!strncmp(token, "Kd", 2)) { parseSep(token += 2);  cur.Kd = getVec3f(token); continue; }
        if (!strncmp(token, "Ks", 2)) { parseSep(token += 2);  cur.Ks = getVec3f(token); continue; }
        if (!strncmp(token, "Kt", 2)) { parseSep(token += 2);  cur.Kt = getVec3f(token); continue; }
        if (!strncmp(token, "Tf", 2)) { parseSep(token += 2);  cur.Kt = getVec3f(token); continue; }
        
        /* extended OBJ */
        if (!strncmp(token, "type", 4)) {
          parseSep(token += 4); std::string type = token;
          if      (type == "matte") cur.type = ExtObjMaterial::MATTE;
          else if (type == "glass") cur.type = ExtObjMaterial::GLASS;
          else if (type == "metal") cur.type = ExtObjMaterial::METAL;
          else if (type == "metallicPaint") cur.type = ExtObjMaterial::METALLIC_PAINT;
          else if (type == "principled") cur.type = ExtObjMaterial::NONE;
          else if (type == "luminous") cur.type = ExtObjMaterial::NONE;
          continue;
        }

        /* OSPRay principled material extensions */
        if (!strncmp(token, "baseColor",         9)) { parseSep(token +=  9); cur.Kd  = getVec3f(token); continue; }
        if (!strncmp(token, "ior",               3)) { parseSep(token +=  3); cur.Ni = getFloat(token); continue; }
        if (!strncmp(token, "map_baseColor",    13)) { parseSep(token += 13); cur.map_Kd = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "map_specular",     12)) { parseSep(token += 12); cur.map_Ks = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "map_normal.scale", 16)) { parseSep(token += 16); continue; }
        if (!strncmp(token, "map_normal",       10)) { parseSep(token += 10); cur.map_Displ = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "transmissionColor",17)) { parseSep(token += 17); cur.Kt = getVec3f(token); continue; }
        if (!strncmp(token, "transmission",     12)) { parseSep(token += 12); cur.Kt = Vec3f(getFloat(token)); continue; }
                
        if (!strncmp(token, "roughnessMap",     12)) { parseSep(token += 12); cur.roughnessMap = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "roughness",         9)) { parseSep(token +=  9); cur.roughness = getFloat(token); cur.Ns = 1.0f/(cur.roughness+1E-6f); continue; }
        if (!strncmp(token, "colorMap",          8)) { parseSep(token +=  8); cur.map_Kd  = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "color",             5)) { parseSep(token +=  5); cur.Kd      = getVec3f(token); continue; }
        if (!strncmp(token, "coat.color",       10)) { parseSep(token += 10); cur.Kd      = getVec3f(token); continue; }
        if (!strncmp(token, "coat.eta",          8)) { parseSep(token +=  8); cur.coat_eta  = getFloat(token); continue; }
        if (!strncmp(token, "coat.roughnessMap",17)) { parseSep(token += 17); cur.coat_roughnessMap   = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "coat.roughness",   14)) { parseSep(token += 14); cur.coat_roughness = getFloat(token); continue; }
        if (!strncmp(token, "bumpMap",           7)) { parseSep(token +=  7); cur.map_Displ = loadTexture(FileName(token)); continue; }
        if (!strncmp(token, "bump",              4)) { parseSep(token +=  4); cur.bump   = getFloat(token); continue; }
        if (!strncmp(token, "eta",               3)) { parseSep(token +=  3); cur.eta = getVec3f(token); continue; }
        if (!strncmp(token, "k",                 1)) { parseSep(token +=  1); cur.k = getVec3f(token); continue; }
      } 
      catch (const std::runtime_error& e) {
        std::cerr << "Error: " << e.what() << std::endl;
      }
    }

    if (name != "") {
      material[name] = cur.select();
      material[name]->name = name;
    }

    cin.close();
  }